

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_movem_16_er_pcdi(void)

{
  uint uVar1;
  uint address;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  uVar1 = m68ki_read_imm_16();
  address = m68ki_get_ea_pcdi();
  iVar4 = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    if ((uVar1 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      uVar2 = m68ki_read_16_fc(address,m68ki_cpu.s_flag | 2);
      m68ki_cpu.dar[lVar3] = (int)(short)uVar2;
      address = address + 2;
      iVar4 = iVar4 + 1;
    }
  }
  m68ki_remaining_cycles = m68ki_remaining_cycles - (iVar4 << ((byte)m68ki_cpu.cyc_movem_w & 0x1f));
  return;
}

Assistant:

static void m68k_op_movem_16_er_pcdi(void)
{
	uint i = 0;
	uint register_list = OPER_I_16();
	uint ea = EA_PCDI_16();
	uint count = 0;

	for(; i < 16; i++)
		if(register_list & (1 << i))
		{
			REG_DA[i] = MAKE_INT_16(MASK_OUT_ABOVE_16(m68ki_read_pcrel_16(ea)));
			ea += 2;
			count++;
		}

	USE_CYCLES(count<<CYC_MOVEM_W);
}